

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::HexFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  LogicalType varargs_02;
  LogicalType varargs_03;
  LogicalType varargs_04;
  LogicalType varargs_05;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  initializer_list<duckdb::LogicalType> __l_05;
  undefined4 in_stack_fffffffffffff4a4;
  undefined4 in_stack_fffffffffffff4ac;
  FunctionNullHandling in_stack_fffffffffffff4b8;
  bind_lambda_function_t in_stack_fffffffffffff4c0;
  LogicalType local_b38;
  scalar_function_t local_b20;
  scalar_function_t local_b00;
  scalar_function_t local_ae0;
  scalar_function_t local_ac0;
  scalar_function_t local_aa0;
  scalar_function_t local_a80;
  scalar_function_t local_a60;
  LogicalType local_a40;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_a28;
  LogicalType local_a10;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_9f8;
  LogicalType local_9e0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_9c8;
  LogicalType local_9b0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_998;
  LogicalType local_980;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_968;
  LogicalType local_950;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_938;
  LogicalType local_920;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_908;
  LogicalType local_8f0;
  LogicalType local_8d8;
  LogicalType local_8c0;
  LogicalType local_8a8;
  LogicalType local_890;
  LogicalType local_878;
  LogicalType local_860;
  ScalarFunction local_848;
  ScalarFunction local_720;
  ScalarFunction local_5f8;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType(&local_b38,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_b38;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_908,__l,(allocator_type *)&stack0xfffffffffffff4c7);
  LogicalType::LogicalType(&local_920,VARCHAR);
  local_a60.super__Function_base._M_functor._8_8_ = 0;
  local_a60.super__Function_base._M_functor._M_unused._M_object =
       ToHexFunction<duckdb::string_t,duckdb::HexStrOperator>;
  local_a60._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_a60.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_860,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_860;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff4a4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff4ac;
  ScalarFunction::ScalarFunction
            (&local_158,(vector<duckdb::LogicalType,_true> *)&local_908,&local_920,&local_a60,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffff4b8,in_stack_fffffffffffff4c0);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  ScalarFunction::~ScalarFunction(&local_158);
  LogicalType::~LogicalType(&local_860);
  ::std::_Function_base::~_Function_base(&local_a60.super__Function_base);
  LogicalType::~LogicalType(&local_920);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_908);
  LogicalType::~LogicalType(&local_b38);
  LogicalType::LogicalType(&local_b38,VARINT);
  __l_00._M_len = 1;
  __l_00._M_array = &local_b38;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_938,__l_00,(allocator_type *)&stack0xfffffffffffff4c7);
  LogicalType::LogicalType(&local_950,VARCHAR);
  local_a80.super__Function_base._M_functor._8_8_ = 0;
  local_a80.super__Function_base._M_functor._M_unused._M_object =
       ToHexFunction<duckdb::string_t,duckdb::HexStrOperator>;
  local_a80._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_a80.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_878,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_878;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff4a4;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff4ac;
  ScalarFunction::ScalarFunction
            (&local_280,(vector<duckdb::LogicalType,_true> *)&local_938,&local_950,&local_a80,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
             in_stack_fffffffffffff4b8,in_stack_fffffffffffff4c0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  ScalarFunction::~ScalarFunction(&local_280);
  LogicalType::~LogicalType(&local_878);
  ::std::_Function_base::~_Function_base(&local_a80.super__Function_base);
  LogicalType::~LogicalType(&local_950);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_938);
  LogicalType::~LogicalType(&local_b38);
  LogicalType::LogicalType(&local_b38,BLOB);
  __l_01._M_len = 1;
  __l_01._M_array = &local_b38;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_968,__l_01,(allocator_type *)&stack0xfffffffffffff4c7);
  LogicalType::LogicalType(&local_980,VARCHAR);
  local_aa0.super__Function_base._M_functor._8_8_ = 0;
  local_aa0.super__Function_base._M_functor._M_unused._M_object =
       ToHexFunction<duckdb::string_t,duckdb::HexStrOperator>;
  local_aa0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_aa0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_890,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_01._0_8_ = &local_890;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff4a4;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff4ac;
  ScalarFunction::ScalarFunction
            (&local_3a8,(vector<duckdb::LogicalType,_true> *)&local_968,&local_980,&local_aa0,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_01,CONSISTENT,
             in_stack_fffffffffffff4b8,in_stack_fffffffffffff4c0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3a8);
  ScalarFunction::~ScalarFunction(&local_3a8);
  LogicalType::~LogicalType(&local_890);
  ::std::_Function_base::~_Function_base(&local_aa0.super__Function_base);
  LogicalType::~LogicalType(&local_980);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_968);
  LogicalType::~LogicalType(&local_b38);
  LogicalType::LogicalType(&local_b38,BIGINT);
  __l_02._M_len = 1;
  __l_02._M_array = &local_b38;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_998,__l_02,(allocator_type *)&stack0xfffffffffffff4c7);
  LogicalType::LogicalType(&local_9b0,VARCHAR);
  local_ac0.super__Function_base._M_functor._8_8_ = 0;
  local_ac0.super__Function_base._M_functor._M_unused._M_object =
       ToHexFunction<long,duckdb::HexIntegralOperator>;
  local_ac0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_ac0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_8a8,INVALID);
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_02._0_8_ = &local_8a8;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff4a4;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff4ac;
  ScalarFunction::ScalarFunction
            (&local_4d0,(vector<duckdb::LogicalType,_true> *)&local_998,&local_9b0,&local_ac0,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_02,CONSISTENT,
             in_stack_fffffffffffff4b8,in_stack_fffffffffffff4c0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_4d0);
  ScalarFunction::~ScalarFunction(&local_4d0);
  LogicalType::~LogicalType(&local_8a8);
  ::std::_Function_base::~_Function_base(&local_ac0.super__Function_base);
  LogicalType::~LogicalType(&local_9b0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_998);
  LogicalType::~LogicalType(&local_b38);
  LogicalType::LogicalType(&local_b38,UBIGINT);
  __l_03._M_len = 1;
  __l_03._M_array = &local_b38;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_9c8,__l_03,(allocator_type *)&stack0xfffffffffffff4c7);
  LogicalType::LogicalType(&local_9e0,VARCHAR);
  local_ae0.super__Function_base._M_functor._8_8_ = 0;
  local_ae0.super__Function_base._M_functor._M_unused._M_object =
       ToHexFunction<unsigned_long,duckdb::HexIntegralOperator>;
  local_ae0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_ae0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_8c0,INVALID);
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_03._0_8_ = &local_8c0;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff4a4;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff4ac;
  ScalarFunction::ScalarFunction
            (&local_5f8,(vector<duckdb::LogicalType,_true> *)&local_9c8,&local_9e0,&local_ae0,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_03,CONSISTENT,
             in_stack_fffffffffffff4b8,in_stack_fffffffffffff4c0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_5f8);
  ScalarFunction::~ScalarFunction(&local_5f8);
  LogicalType::~LogicalType(&local_8c0);
  ::std::_Function_base::~_Function_base(&local_ae0.super__Function_base);
  LogicalType::~LogicalType(&local_9e0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_9c8);
  LogicalType::~LogicalType(&local_b38);
  LogicalType::LogicalType(&local_b38,HUGEINT);
  __l_04._M_len = 1;
  __l_04._M_array = &local_b38;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_9f8,__l_04,(allocator_type *)&stack0xfffffffffffff4c7);
  LogicalType::LogicalType(&local_a10,VARCHAR);
  local_b00.super__Function_base._M_functor._8_8_ = 0;
  local_b00.super__Function_base._M_functor._M_unused._M_object =
       ToHexFunction<duckdb::hugeint_t,duckdb::HexHugeIntOperator>;
  local_b00._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_b00.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_8d8,INVALID);
  varargs_04.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_04._0_8_ = &local_8d8;
  varargs_04.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff4a4;
  varargs_04.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_04.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff4ac;
  ScalarFunction::ScalarFunction
            (&local_720,(vector<duckdb::LogicalType,_true> *)&local_9f8,&local_a10,&local_b00,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_04,CONSISTENT,
             in_stack_fffffffffffff4b8,in_stack_fffffffffffff4c0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_720);
  ScalarFunction::~ScalarFunction(&local_720);
  LogicalType::~LogicalType(&local_8d8);
  ::std::_Function_base::~_Function_base(&local_b00.super__Function_base);
  LogicalType::~LogicalType(&local_a10);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_9f8);
  LogicalType::~LogicalType(&local_b38);
  LogicalType::LogicalType(&local_b38,UHUGEINT);
  __l_05._M_len = 1;
  __l_05._M_array = &local_b38;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_a28,__l_05,(allocator_type *)&stack0xfffffffffffff4c7);
  LogicalType::LogicalType(&local_a40,VARCHAR);
  local_b20.super__Function_base._M_functor._8_8_ = 0;
  local_b20.super__Function_base._M_functor._M_unused._M_object =
       ToHexFunction<duckdb::uhugeint_t,duckdb::HexUhugeIntOperator>;
  local_b20._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_b20.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_8f0,INVALID);
  varargs_05.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_05._0_8_ = &local_8f0;
  varargs_05.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff4a4;
  varargs_05.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_05.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff4ac;
  ScalarFunction::ScalarFunction
            (&local_848,(vector<duckdb::LogicalType,_true> *)&local_a28,&local_a40,&local_b20,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_05,CONSISTENT,
             in_stack_fffffffffffff4b8,in_stack_fffffffffffff4c0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_848);
  ScalarFunction::~ScalarFunction(&local_848);
  LogicalType::~LogicalType(&local_8f0);
  ::std::_Function_base::~_Function_base(&local_b20.super__Function_base);
  LogicalType::~LogicalType(&local_a40);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_a28);
  LogicalType::~LogicalType(&local_b38);
  return in_RDI;
}

Assistant:

ScalarFunctionSet HexFun::GetFunctions() {
	ScalarFunctionSet to_hex;
	to_hex.AddFunction(
	    ScalarFunction({LogicalType::VARCHAR}, LogicalType::VARCHAR, ToHexFunction<string_t, HexStrOperator>));
	to_hex.AddFunction(
	    ScalarFunction({LogicalType::VARINT}, LogicalType::VARCHAR, ToHexFunction<string_t, HexStrOperator>));
	to_hex.AddFunction(
	    ScalarFunction({LogicalType::BLOB}, LogicalType::VARCHAR, ToHexFunction<string_t, HexStrOperator>));
	to_hex.AddFunction(
	    ScalarFunction({LogicalType::BIGINT}, LogicalType::VARCHAR, ToHexFunction<int64_t, HexIntegralOperator>));
	to_hex.AddFunction(
	    ScalarFunction({LogicalType::UBIGINT}, LogicalType::VARCHAR, ToHexFunction<uint64_t, HexIntegralOperator>));
	to_hex.AddFunction(
	    ScalarFunction({LogicalType::HUGEINT}, LogicalType::VARCHAR, ToHexFunction<hugeint_t, HexHugeIntOperator>));
	to_hex.AddFunction(
	    ScalarFunction({LogicalType::UHUGEINT}, LogicalType::VARCHAR, ToHexFunction<uhugeint_t, HexUhugeIntOperator>));
	return to_hex;
}